

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::reverse_horizontal(Image *this)

{
  uint64_t local_60;
  uint64_t a2;
  uint64_t b2;
  uint64_t g2;
  uint64_t r2;
  uint64_t a1;
  uint64_t b1;
  uint64_t g1;
  uint64_t r1;
  ssize_t x;
  ssize_t y;
  Image *this_local;
  
  y = (ssize_t)this;
  for (x = 0; x < this->height; x = x + 1) {
    for (r1 = 0; (long)r1 < this->width / 2; r1 = r1 + 1) {
      read_pixel(this,r1,x,&g1,&b1,&a1,&r2);
      read_pixel(this,(this->width - r1) + -1,x,&g2,&b2,&a2,&local_60);
      write_pixel(this,(this->width - r1) + -1,x,g1,b1,a1,r2);
      write_pixel(this,r1,x,g2,b2,a2,local_60);
    }
  }
  return;
}

Assistant:

void Image::reverse_horizontal() {
  for (ssize_t y = 0; y < this->height; y++) {
    for (ssize_t x = 0; x < this->width / 2; x++) {
      uint64_t r1, g1, b1, a1, r2, g2, b2, a2;
      this->read_pixel(x, y, &r1, &g1, &b1, &a1);
      this->read_pixel(this->width - x - 1, y, &r2, &g2, &b2, &a2);
      this->write_pixel(this->width - x - 1, y, r1, g1, b1, a1);
      this->write_pixel(x, y, r2, g2, b2, a2);
    }
  }
}